

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::ValueImpl<false>::ValueImpl<true>
          (ValueImpl<false> *this,ValueImpl<true> *that)

{
  ValueImpl<true> *that_local;
  ValueImpl<false> *this_local;
  
  std::variant<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>::
  variant(&this->value);
  std::__cxx11::string::string((string *)&this->consume_after);
  this->consume_parens_if_empty = false;
  operator=(this,that);
  return;
}

Assistant:

ValueImpl(const ValueImpl<that_owned>& that) {  // NOLINT
    *this = that;
  }